

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int streamMemParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  xmlTextReaderPtr reader;
  int in_R9D;
  int size;
  char *base;
  int local_3c;
  char *local_38;
  
  iVar1 = loadMem(filename,&local_38,&local_3c);
  if (iVar1 == 0) {
    reader = (xmlTextReaderPtr)xmlReaderForMemory(local_38,local_3c,filename,0);
    iVar1 = streamProcessTest(filename,result,err,reader,(char *)0x0,in_R9D);
    free(local_38);
    xmlFreeTextReader(reader);
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",filename);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
streamMemParseTest(const char *filename, const char *result, const char *err,
                   int options) {
    xmlTextReaderPtr reader;
    int ret;
    const char *base;
    int size;

    /*
     * load and parse the memory
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }
    reader = xmlReaderForMemory(base, size, filename, NULL, options);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    free((char *)base);
    xmlFreeTextReader(reader);
    return(ret);
}